

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O2

void __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>::
rt_binary_expr<8l,viennamath::op_div<double>,8l>
          (rt_binary_expr<viennamath::rt_expression_interface<double>> *this,
          ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_div<double>,_viennamath::ct_constant<8L>_>
          *param_1)

{
  undefined8 *puVar1;
  auto_ptr_ref<viennamath::rt_expression_interface<double>_> aVar2;
  
  *(undefined ***)this = &PTR__rt_binary_expr_001330d8;
  *(undefined8 *)(this + 8) = 0;
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = &PTR__op_interface_001337d8;
  *(undefined8 **)(this + 0x10) = puVar1;
  *(undefined8 *)(this + 0x18) = 0;
  aVar2._M_ptr = (rt_expression_interface<double> *)operator_new(0x10);
  (aVar2._M_ptr)->_vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001333a8;
  aVar2._M_ptr[1]._vptr_rt_expression_interface = (_func_int **)0x4020000000000000;
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator=
            ((auto_ptr<viennamath::rt_expression_interface<double>_> *)(this + 8),aVar2);
  aVar2._M_ptr = (rt_expression_interface<double> *)operator_new(0x10);
  (aVar2._M_ptr)->_vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001333a8;
  aVar2._M_ptr[1]._vptr_rt_expression_interface = (_func_int **)0x4020000000000000;
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator=
            ((auto_ptr<viennamath::rt_expression_interface<double>_> *)(this + 0x18),aVar2);
  return;
}

Assistant:

explicit rt_binary_expr(ct_binary_expr<ct_constant<value1>, OP, ct_constant<value2> > const & /*other*/) : op_(new op_binary<OP, InterfaceType>())
      {
        //std::cout << "Constructing from expression " << other << " to " << OP::apply(value1, value2) << std::endl;
        lhs_ = std::auto_ptr<InterfaceType>(new rt_constant<numeric_type, InterfaceType>(value1));
        rhs_ = std::auto_ptr<InterfaceType>(new rt_constant<numeric_type, InterfaceType>(value2));
      }